

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O0

Error __thiscall
llvm::DWARFDebugRangeList::extract
          (DWARFDebugRangeList *this,DWARFDataExtractor *data,uint64_t *offset_ptr)

{
  bool bVar1;
  uint8_t uVar2;
  uint64_t *in_RCX;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  Error local_80;
  error_code local_78;
  uint64_t local_68;
  uint64_t prev_offset;
  RangeListEntry Entry;
  char *local_40;
  error_code local_38;
  uint64_t *local_28;
  uint64_t *offset_ptr_local;
  DWARFDataExtractor *data_local;
  DWARFDebugRangeList *this_local;
  
  local_28 = in_RCX;
  offset_ptr_local = offset_ptr;
  data_local = data;
  this_local = this;
  clear((DWARFDebugRangeList *)data);
  bVar1 = DataExtractor::isValidOffset((DataExtractor *)offset_ptr_local,*local_28);
  if (bVar1) {
    uVar2 = DataExtractor::getAddressSize((DataExtractor *)offset_ptr_local);
    *(uint8_t *)&(data->super_DataExtractor).Data.Length = uVar2;
    if (((char)(data->super_DataExtractor).Data.Length == '\x04') ||
       ((char)(data->super_DataExtractor).Data.Length == '\b')) {
      (data->super_DataExtractor).Data.Data = (char *)*local_28;
      while( true ) {
        Entry.EndAddress = 0xffffffffffffffff;
        local_68 = *local_28;
        prev_offset = DWARFDataExtractor::getRelocatedAddress
                                ((DWARFDataExtractor *)offset_ptr_local,local_28,(uint64_t *)0x0);
        Entry.StartAddress =
             DWARFDataExtractor::getRelocatedAddress
                       ((DWARFDataExtractor *)offset_ptr_local,local_28,&Entry.EndAddress);
        if (*local_28 !=
            local_68 + (long)(int)((uint)(byte)(data->super_DataExtractor).Data.Length << 1)) break;
        bVar1 = RangeListEntry::isEndOfListEntry((RangeListEntry *)&prev_offset);
        if (bVar1) {
          Error::success();
          Error::Error((Error *)this,&local_80);
          ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_80);
          return (Error)(ErrorInfoBase *)this;
        }
        std::
        vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
        ::push_back((vector<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                     *)&(data->super_DataExtractor).IsLittleEndian,(value_type *)&prev_offset);
      }
      clear((DWARFDebugRangeList *)data);
      std::error_code::error_code<llvm::errc,void>(&local_78,invalid_argument);
      EC_01._M_cat._0_4_ = local_78._M_value;
      EC_01._0_8_ = this;
      EC_01._M_cat._4_4_ = 0;
      createStringError<unsigned_long>
                (EC_01,(char *)local_78._M_cat,
                 (unsigned_long *)"invalid range list entry at offset 0x%lx");
    }
    else {
      std::error_code::error_code<llvm::errc,void>
                ((error_code *)&Entry.SectionIndex,invalid_argument);
      EC_00._M_cat._0_4_ = (undefined4)Entry.SectionIndex;
      EC_00._0_8_ = this;
      EC_00._M_cat._4_4_ = 0;
      createStringError<unsigned_char>(EC_00,local_40,(uchar *)"invalid address size: %u");
    }
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_38,invalid_argument);
    EC._M_cat._0_4_ = local_38._M_value;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError<unsigned_long>
              (EC,(char *)local_38._M_cat,(unsigned_long *)"invalid range list offset 0x%lx");
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugRangeList::extract(const DWARFDataExtractor &data,
                                   uint64_t *offset_ptr) {
  clear();
  if (!data.isValidOffset(*offset_ptr))
    return createStringError(errc::invalid_argument,
                       "invalid range list offset 0x%" PRIx64, *offset_ptr);

  AddressSize = data.getAddressSize();
  if (AddressSize != 4 && AddressSize != 8)
    return createStringError(errc::invalid_argument,
                       "invalid address size: %" PRIu8, AddressSize);
  Offset = *offset_ptr;
  while (true) {
    RangeListEntry Entry;
    Entry.SectionIndex = -1ULL;

    uint64_t prev_offset = *offset_ptr;
    Entry.StartAddress = data.getRelocatedAddress(offset_ptr);
    Entry.EndAddress =
        data.getRelocatedAddress(offset_ptr, &Entry.SectionIndex);

    // Check that both values were extracted correctly.
    if (*offset_ptr != prev_offset + 2 * AddressSize) {
      clear();
      return createStringError(errc::invalid_argument,
                         "invalid range list entry at offset 0x%" PRIx64,
                         prev_offset);
    }
    if (Entry.isEndOfListEntry())
      break;
    Entries.push_back(Entry);
  }
  return Error::success();
}